

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionDispatcher.cpp
# Opt level: O0

void __thiscall
btCollisionDispatcher::btCollisionDispatcher
          (btCollisionDispatcher *this,btCollisionConfiguration *collisionConfiguration)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  btCollisionConfiguration *in_RSI;
  btCollisionDispatcher *in_RDI;
  int j;
  int i;
  btManifoldResult *in_stack_ffffffffffffffb0;
  uint local_24;
  uint local_20;
  
  btDispatcher::btDispatcher(&in_RDI->super_btDispatcher);
  (in_RDI->super_btDispatcher)._vptr_btDispatcher =
       (_func_int **)&PTR__btCollisionDispatcher_002e2630;
  in_RDI->m_dispatcherFlags = 2;
  btAlignedObjectArray<btPersistentManifold_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btPersistentManifold_*> *)in_stack_ffffffffffffffb0);
  btManifoldResult::btManifoldResult(in_stack_ffffffffffffffb0);
  in_RDI->m_collisionConfiguration = in_RSI;
  setNearCallback(in_RDI,defaultNearCallback);
  iVar1 = (*in_RSI->_vptr_btCollisionConfiguration[3])();
  in_RDI->m_collisionAlgorithmPoolAllocator = (btPoolAllocator *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*in_RSI->_vptr_btCollisionConfiguration[2])();
  in_RDI->m_persistentManifoldPoolAllocator = (btPoolAllocator *)CONCAT44(extraout_var_00,iVar1);
  for (local_20 = 0; (int)local_20 < 0x24; local_20 = local_20 + 1) {
    for (local_24 = 0; (int)local_24 < 0x24; local_24 = local_24 + 1) {
      iVar1 = (*in_RDI->m_collisionConfiguration->_vptr_btCollisionConfiguration[4])
                        (in_RDI->m_collisionConfiguration,(ulong)local_20,(ulong)local_24);
      in_RDI->m_doubleDispatch[(int)local_20][(int)local_24] =
           (btCollisionAlgorithmCreateFunc *)CONCAT44(extraout_var_01,iVar1);
    }
  }
  return;
}

Assistant:

btCollisionDispatcher::btCollisionDispatcher (btCollisionConfiguration* collisionConfiguration): 
m_dispatcherFlags(btCollisionDispatcher::CD_USE_RELATIVE_CONTACT_BREAKING_THRESHOLD),
	m_collisionConfiguration(collisionConfiguration)
{
	int i;

	setNearCallback(defaultNearCallback);
	
	m_collisionAlgorithmPoolAllocator = collisionConfiguration->getCollisionAlgorithmPool();

	m_persistentManifoldPoolAllocator = collisionConfiguration->getPersistentManifoldPool();

	for (i=0;i<MAX_BROADPHASE_COLLISION_TYPES;i++)
	{
		for (int j=0;j<MAX_BROADPHASE_COLLISION_TYPES;j++)
		{
			m_doubleDispatch[i][j] = m_collisionConfiguration->getCollisionAlgorithmCreateFunc(i,j);
			btAssert(m_doubleDispatch[i][j]);
		}
	}
	
	
}